

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_mem.c
# Opt level: O0

int mem_free(BIO *a)

{
  void *ptr;
  long in_RDI;
  BIO_BUF_MEM *bb;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    iVar1 = 0;
  }
  else {
    ptr = *(void **)(in_RDI + 0x40);
    iVar1 = mem_buf_free((BIO *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      CRYPTO_free(*(void **)((long)ptr + 8));
      CRYPTO_free(ptr);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int mem_free(BIO *a)
{
    BIO_BUF_MEM *bb;

    if (a == NULL)
        return 0;

    bb = (BIO_BUF_MEM *)a->ptr;
    if (!mem_buf_free(a))
        return 0;
    OPENSSL_free(bb->readp);
    OPENSSL_free(bb);
    return 1;
}